

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodelserialiser.cpp
# Opt level: O3

bool __thiscall
XmlModelSerialiserPrivate::writeXml(XmlModelSerialiserPrivate *this,QXmlStreamWriter *writer)

{
  QAbstractItemModel *pQVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  QVariant roleData;
  QString roleString;
  QString local_98;
  QArrayData *local_80 [3];
  undefined1 local_68 [32];
  QString local_48;
  
  if ((this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
      m_constModel == (QAbstractItemModel *)0x0) {
    bVar3 = 0;
  }
  else {
    if (this->m_printStartDocument == true) {
      QXmlStreamWriter::writeStartDocument();
    }
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"ItemModel";
    local_68._16_8_ = (QAbstractItemModel *)0x9;
    QXmlStreamWriter::writeStartElement((QString *)writer);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_68._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,8);
      }
    }
    local_68._0_8_ = -NAN;
    local_68._8_8_ = 0;
    local_68._16_8_ = (QAbstractItemModel *)0x0;
    writeXmlElement(this,writer,(QModelIndex *)local_68);
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"HeaderData";
    local_68._16_8_ = (QAbstractItemModel *)0xa;
    QXmlStreamWriter::writeStartElement((QString *)writer);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_68._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,8);
      }
    }
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"Horizontal";
    local_68._16_8_ = (QAbstractItemModel *)0xa;
    QXmlStreamWriter::writeStartElement((QString *)writer);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_68._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,8);
      }
    }
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_constModel;
    local_68._0_8_ = -NAN;
    local_68._8_8_ = 0;
    local_68._16_8_ = (QAbstractItemModel *)0x0;
    iVar4 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_68);
    if (0 < iVar4) {
      iVar4 = 0;
      do {
        if ((this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
            m_rolesToSave.d.size != 0) {
          piVar7 = (this->super_AbstractStringSerialiserPrivate).
                   super_AbstractModelSerialiserPrivate.m_rolesToSave.d.ptr;
          do {
            pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                     super_AbstractModelSerialiserPrivate.m_constModel;
            (**(code **)(*(long *)pQVar1 + 0xa0))((QVariant *)local_68,pQVar1,iVar4,1,*piVar7);
            cVar2 = ::QVariant::isNull();
            if (cVar2 == '\0') {
              AbstractStringSerialiserPrivate::saveVariant
                        (&local_48,&this->super_AbstractStringSerialiserPrivate,(QVariant *)local_68
                        );
              if (local_48.d.size != 0) {
                local_98.d.d = (Data *)0x0;
                local_98.d.ptr = L"HeaderDataPoint";
                local_98.d.size = 0xf;
                QXmlStreamWriter::writeStartElement((QString *)writer);
                if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
                  }
                }
                local_98.d.d = (Data *)0x0;
                local_98.d.ptr = L"Section";
                local_98.d.size = 7;
                iVar6 = (int)local_80;
                QString::number(iVar6,iVar4);
                QXmlStreamWriter::writeAttribute((QString *)writer,&local_98);
                if (local_80[0] != (QArrayData *)0x0) {
                  LOCK();
                  (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_80[0],2,8);
                  }
                }
                if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
                  }
                }
                local_98.d.d = (Data *)0x0;
                local_98.d.ptr = L"Role";
                local_98.d.size = 4;
                QString::number(iVar6,*piVar7);
                QXmlStreamWriter::writeAttribute((QString *)writer,&local_98);
                if (local_80[0] != (QArrayData *)0x0) {
                  LOCK();
                  (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_80[0],2,8);
                  }
                }
                if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
                  }
                }
                local_98.d.d = (Data *)0x0;
                local_98.d.ptr = L"Type";
                local_98.d.size = 4;
                iVar5 = ::QVariant::typeId((QVariant *)local_68);
                QString::number(iVar6,iVar5);
                QXmlStreamWriter::writeAttribute((QString *)writer,&local_98);
                if (local_80[0] != (QArrayData *)0x0) {
                  LOCK();
                  (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_80[0],2,8);
                  }
                }
                if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
                  }
                }
                QXmlStreamWriter::writeCharacters((QString *)writer);
                QXmlStreamWriter::writeEndElement();
              }
              if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
                }
              }
            }
            ::QVariant::~QVariant((QVariant *)local_68);
            piVar7 = piVar7 + 1;
          } while (piVar7 != (this->super_AbstractStringSerialiserPrivate).
                             super_AbstractModelSerialiserPrivate.m_rolesToSave.d.ptr +
                             (this->super_AbstractStringSerialiserPrivate).
                             super_AbstractModelSerialiserPrivate.m_rolesToSave.d.size);
        }
        iVar4 = iVar4 + 1;
        pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_constModel;
        local_68._0_8_ = (PrivateShared *)0xffffffffffffffff;
        local_68._8_8_ = 0;
        local_68._16_8_ = (QAbstractItemModel *)0x0;
        iVar6 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,(QVariant *)local_68);
      } while (iVar4 < iVar6);
    }
    QXmlStreamWriter::writeEndElement();
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"Vertical";
    local_68._16_8_ = (QAbstractItemModel *)0x8;
    QXmlStreamWriter::writeStartElement((QString *)writer);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_68._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,8);
      }
    }
    local_68._0_8_ = -NAN;
    local_68._8_8_ = 0;
    local_68._16_8_ = (QAbstractItemModel *)0x0;
    iVar4 = (**(code **)(*(long *)(this->super_AbstractStringSerialiserPrivate).
                                  super_AbstractModelSerialiserPrivate.m_constModel + 0x78))();
    if (0 < iVar4) {
      iVar4 = 0;
      do {
        if ((this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
            m_rolesToSave.d.size != 0) {
          piVar7 = (this->super_AbstractStringSerialiserPrivate).
                   super_AbstractModelSerialiserPrivate.m_rolesToSave.d.ptr;
          do {
            pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                     super_AbstractModelSerialiserPrivate.m_constModel;
            (**(code **)(*(long *)pQVar1 + 0xa0))((QVariant *)local_68,pQVar1,iVar4,2,*piVar7);
            cVar2 = ::QVariant::isNull();
            if (cVar2 == '\0') {
              AbstractStringSerialiserPrivate::saveVariant
                        (&local_48,&this->super_AbstractStringSerialiserPrivate,(QVariant *)local_68
                        );
              if (local_48.d.size != 0) {
                local_98.d.d = (Data *)0x0;
                local_98.d.ptr = L"HeaderDataPoint";
                local_98.d.size = 0xf;
                QXmlStreamWriter::writeStartElement((QString *)writer);
                if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
                  }
                }
                local_98.d.d = (Data *)0x0;
                local_98.d.ptr = L"Section";
                local_98.d.size = 7;
                iVar6 = (int)local_80;
                QString::number(iVar6,iVar4);
                QXmlStreamWriter::writeAttribute((QString *)writer,&local_98);
                if (local_80[0] != (QArrayData *)0x0) {
                  LOCK();
                  (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_80[0],2,8);
                  }
                }
                if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
                  }
                }
                local_98.d.d = (Data *)0x0;
                local_98.d.ptr = L"Role";
                local_98.d.size = 4;
                QString::number(iVar6,*piVar7);
                QXmlStreamWriter::writeAttribute((QString *)writer,&local_98);
                if (local_80[0] != (QArrayData *)0x0) {
                  LOCK();
                  (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_80[0],2,8);
                  }
                }
                if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
                  }
                }
                local_98.d.d = (Data *)0x0;
                local_98.d.ptr = L"Type";
                local_98.d.size = 4;
                iVar5 = ::QVariant::typeId((QVariant *)local_68);
                QString::number(iVar6,iVar5);
                QXmlStreamWriter::writeAttribute((QString *)writer,&local_98);
                if (local_80[0] != (QArrayData *)0x0) {
                  LOCK();
                  (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_80[0],2,8);
                  }
                }
                if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
                  }
                }
                QXmlStreamWriter::writeCharacters((QString *)writer);
                QXmlStreamWriter::writeEndElement();
              }
              if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
                }
              }
            }
            ::QVariant::~QVariant((QVariant *)local_68);
            piVar7 = piVar7 + 1;
          } while (piVar7 != (this->super_AbstractStringSerialiserPrivate).
                             super_AbstractModelSerialiserPrivate.m_rolesToSave.d.ptr +
                             (this->super_AbstractStringSerialiserPrivate).
                             super_AbstractModelSerialiserPrivate.m_rolesToSave.d.size);
        }
        iVar4 = iVar4 + 1;
        pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_constModel;
        local_68._0_8_ = (PrivateShared *)0xffffffffffffffff;
        local_68._8_8_ = 0;
        local_68._16_8_ = (QAbstractItemModel *)0x0;
        iVar6 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,(QVariant *)local_68);
      } while (iVar4 < iVar6);
    }
    QXmlStreamWriter::writeEndElement();
    QXmlStreamWriter::writeEndElement();
    QXmlStreamWriter::writeEndElement();
    if (this->m_printStartDocument != false) {
      QXmlStreamWriter::writeEndDocument();
    }
    bVar3 = QXmlStreamWriter::hasError();
    bVar3 = bVar3 ^ 1;
  }
  return (bool)bVar3;
}

Assistant:

bool XmlModelSerialiserPrivate::writeXml(QXmlStreamWriter &writer) const
{
    if (!m_constModel)
        return false;
    if (m_printStartDocument)
        writer.writeStartDocument();
    writer.writeStartElement(QStringLiteral("ItemModel"));
    writeXmlElement(writer);
    writer.writeStartElement(QStringLiteral("HeaderData"));
    writer.writeStartElement(QStringLiteral("Horizontal"));
    for (int i = 0; i < m_constModel->columnCount(); ++i) {
        for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
            const QVariant roleData = m_constModel->headerData(i, Qt::Horizontal, *singleRole);
            if (roleData.isNull())
                continue;
            const QString roleString = saveVariant(roleData);
            if (roleString.isEmpty())
                continue; // Skip unhandled types
            writer.writeStartElement(QStringLiteral("HeaderDataPoint"));
            writer.writeAttribute(QStringLiteral("Section"), QString::number(i));
            writer.writeAttribute(QStringLiteral("Role"), QString::number(*singleRole));
            writer.writeAttribute(QStringLiteral("Type"), QString::number(roleData.userType()));
            writer.writeCharacters(roleString);
            writer.writeEndElement(); // HeaderDataPoint
        }
    }
    writer.writeEndElement(); // Horizontal
    writer.writeStartElement(QStringLiteral("Vertical"));
    for (int i = 0; i < m_constModel->rowCount(); ++i) {
        for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
            const QVariant roleData = m_constModel->headerData(i, Qt::Vertical, *singleRole);
            if (roleData.isNull())
                continue;
            const QString roleString = saveVariant(roleData);
            if (roleString.isEmpty())
                continue; // Skip unhandled types
            writer.writeStartElement(QStringLiteral("HeaderDataPoint"));
            writer.writeAttribute(QStringLiteral("Section"), QString::number(i));
            writer.writeAttribute(QStringLiteral("Role"), QString::number(*singleRole));
            writer.writeAttribute(QStringLiteral("Type"), QString::number(roleData.userType()));
            writer.writeCharacters(roleString);
            writer.writeEndElement(); // HeaderDataPoint
        }
    }
    writer.writeEndElement(); // Vertical
    writer.writeEndElement(); // HeaderData
    writer.writeEndElement(); // ItemModel
    if (m_printStartDocument)
        writer.writeEndDocument();
    return !writer.hasError();
}